

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

int byteoffset(lua_State *L)

{
  lua_Integer lVar1;
  ulong uVar2;
  lua_Integer def;
  ulong uVar3;
  long lVar4;
  size_t len;
  
  luaL_checklstring(L,1,&len);
  lVar1 = luaL_checkinteger(L,2);
  def = 1;
  if (lVar1 < 0) {
    def = len + 1;
  }
  uVar2 = luaL_optinteger(L,3,def);
  if ((long)uVar2 < 0) {
    if (-uVar2 <= len) {
      uVar2 = uVar2 + len + 1;
      goto LAB_0011906c;
    }
    uVar2 = 0;
  }
  else {
LAB_0011906c:
    if ((0 < (long)uVar2) && (uVar2 = uVar2 - 1, (long)uVar2 <= (long)len)) goto LAB_0011908b;
  }
  luaL_argerror(L,3,"position out of range");
LAB_0011908b:
  if (lVar1 == 0) {
    uVar3 = (long)uVar2 >> 0x3f & uVar2;
    if (0 < (long)uVar2) {
      uVar3 = uVar2;
    }
  }
  else {
    lVar4 = lVar1;
    if (lVar1 < 0) {
      while ((lVar1 < 0 && (0 < (long)uVar2))) {
        if (uVar2 < 2) {
          uVar2 = 0;
        }
        else {
          uVar2 = uVar2 - 1;
        }
        lVar1 = lVar1 + 1;
      }
    }
    else {
      for (; (lVar1 = lVar4 + -1, 1 < lVar4 && ((long)uVar2 < (long)len)); uVar2 = uVar2 + 1) {
        lVar4 = lVar1;
      }
    }
    uVar3 = uVar2;
    if (lVar1 != 0) {
      lua_pushnil(L);
      return 1;
    }
  }
  lua_pushinteger(L,uVar3 + 1);
  return 1;
}

Assistant:

static int byteoffset(lua_State *L) {
    size_t len;
    const char *s = luaL_checklstring(L, 1, &len);
    lua_Integer n = luaL_checkinteger(L, 2);
    lua_Integer posi = (n >= 0) ? 1 : len + 1;
    posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
    luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer) len, 3,
                  "position out of range");
    if (n == 0) {
        /* find beginning of current byte sequence */
        while (posi > 0 && iscont(s + posi)) posi--;
    } else {
        if (iscont(s + posi))
            luaL_error(L, "initial position is a continuation byte");
        if (n < 0) {
            while (n < 0 && posi > 0) {  /* move back */
                do {  /* find beginning of previous character */
                    posi--;
                } while (posi > 0 && iscont(s + posi));
                n++;
            }
        } else {
            n--;  /* do not move for 1st character */
            while (n > 0 && posi < (lua_Integer) len) {
                do {  /* find beginning of next character */
                    posi++;
                } while (iscont(s + posi));  /* (cannot pass final '\0') */
                n--;
            }
        }
    }
    if (n == 0)  /* did it find given character? */
        lua_pushinteger(L, posi + 1);
    else  /* no such character */
        lua_pushnil(L);
    return 1;
}